

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGDumpDefine(FILE *output,xmlRelaxNGDefinePtr_conflict define)

{
  char *__ptr;
  size_t sStack_20;
  
  if (define == (xmlRelaxNGDefinePtr_conflict)0x0) {
switchD_00184208_caseD_2:
    return;
  }
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
    __ptr = "<empty/>\n";
    sStack_20 = 9;
    break;
  case XML_RELAXNG_NOT_ALLOWED:
    __ptr = "<notAllowed/>\n";
    sStack_20 = 0xe;
    break;
  default:
    goto switchD_00184208_caseD_2;
  case XML_RELAXNG_TEXT:
    __ptr = "<text/>\n";
    sStack_20 = 8;
    break;
  case XML_RELAXNG_ELEMENT:
    fwrite("<element>\n",10,1,(FILE *)output);
    if (define->name != (xmlChar *)0x0) {
      fwrite("<name",5,1,(FILE *)output);
      if (define->ns != (xmlChar *)0x0) {
        fprintf((FILE *)output," ns=\"%s\"");
      }
      fprintf((FILE *)output,">%s</name>\n",define->name);
    }
    xmlRelaxNGDumpDefines(output,define->attrs);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</element>\n";
    sStack_20 = 0xb;
    break;
  case XML_RELAXNG_LIST:
    fwrite("<list>\n",7,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</list>\n";
    sStack_20 = 8;
    break;
  case XML_RELAXNG_ATTRIBUTE:
    fwrite("<attribute>\n",0xc,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</attribute>\n";
    goto LAB_00184423;
  case XML_RELAXNG_DEF:
    fwrite("<define",7,1,(FILE *)output);
    if (define->name != (xmlChar *)0x0) {
      fprintf((FILE *)output," name=\"%s\"");
    }
    fwrite(">\n",2,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</define>\n";
    goto LAB_001844b3;
  case XML_RELAXNG_REF:
    fwrite("<ref",4,1,(FILE *)output);
    if (define->name != (xmlChar *)0x0) {
      fprintf((FILE *)output," name=\"%s\"");
    }
    fwrite(">\n",2,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</ref>\n";
    sStack_20 = 7;
    break;
  case XML_RELAXNG_EXTERNALREF:
    fwrite("<externalRef>",0xd,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</externalRef>\n";
    sStack_20 = 0xf;
    break;
  case XML_RELAXNG_PARENTREF:
    fwrite("<parentRef",10,1,(FILE *)output);
    if (define->name != (xmlChar *)0x0) {
      fprintf((FILE *)output," name=\"%s\"");
    }
    fwrite(">\n",2,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</parentRef>\n";
    goto LAB_00184423;
  case XML_RELAXNG_OPTIONAL:
    fwrite("<optional>\n",0xb,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</optional>\n";
    sStack_20 = 0xc;
    break;
  case XML_RELAXNG_ZEROORMORE:
    fwrite("<zeroOrMore>\n",0xd,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</zeroOrMore>\n";
    goto LAB_001845ab;
  case XML_RELAXNG_ONEORMORE:
    fwrite("<oneOrMore>\n",0xc,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</oneOrMore>\n";
LAB_00184423:
    sStack_20 = 0xd;
    break;
  case XML_RELAXNG_CHOICE:
    fwrite("<choice>\n",9,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</choice>\n";
LAB_001844b3:
    sStack_20 = 10;
    break;
  case XML_RELAXNG_GROUP:
    fwrite("<group>\n",8,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</group>\n";
    sStack_20 = 9;
    break;
  case XML_RELAXNG_INTERLEAVE:
    fwrite("<interleave>\n",0xd,1,(FILE *)output);
    xmlRelaxNGDumpDefines(output,define->content);
    __ptr = "</interleave>\n";
LAB_001845ab:
    sStack_20 = 0xe;
    break;
  case XML_RELAXNG_NOOP:
    xmlRelaxNGDumpDefines(output,define->content);
    return;
  }
  fwrite(__ptr,sStack_20,1,(FILE *)output);
  return;
}

Assistant:

static void
xmlRelaxNGDumpDefine(FILE * output, xmlRelaxNGDefinePtr define)
{
    if (define == NULL)
        return;
    switch (define->type) {
        case XML_RELAXNG_EMPTY:
            fprintf(output, "<empty/>\n");
            break;
        case XML_RELAXNG_NOT_ALLOWED:
            fprintf(output, "<notAllowed/>\n");
            break;
        case XML_RELAXNG_TEXT:
            fprintf(output, "<text/>\n");
            break;
        case XML_RELAXNG_ELEMENT:
            fprintf(output, "<element>\n");
            if (define->name != NULL) {
                fprintf(output, "<name");
                if (define->ns != NULL)
                    fprintf(output, " ns=\"%s\"", define->ns);
                fprintf(output, ">%s</name>\n", define->name);
            }
            xmlRelaxNGDumpDefines(output, define->attrs);
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</element>\n");
            break;
        case XML_RELAXNG_LIST:
            fprintf(output, "<list>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</list>\n");
            break;
        case XML_RELAXNG_ONEORMORE:
            fprintf(output, "<oneOrMore>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</oneOrMore>\n");
            break;
        case XML_RELAXNG_ZEROORMORE:
            fprintf(output, "<zeroOrMore>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</zeroOrMore>\n");
            break;
        case XML_RELAXNG_CHOICE:
            fprintf(output, "<choice>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</choice>\n");
            break;
        case XML_RELAXNG_GROUP:
            fprintf(output, "<group>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</group>\n");
            break;
        case XML_RELAXNG_INTERLEAVE:
            fprintf(output, "<interleave>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</interleave>\n");
            break;
        case XML_RELAXNG_OPTIONAL:
            fprintf(output, "<optional>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</optional>\n");
            break;
        case XML_RELAXNG_ATTRIBUTE:
            fprintf(output, "<attribute>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</attribute>\n");
            break;
        case XML_RELAXNG_DEF:
            fprintf(output, "<define");
            if (define->name != NULL)
                fprintf(output, " name=\"%s\"", define->name);
            fprintf(output, ">\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</define>\n");
            break;
        case XML_RELAXNG_REF:
            fprintf(output, "<ref");
            if (define->name != NULL)
                fprintf(output, " name=\"%s\"", define->name);
            fprintf(output, ">\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</ref>\n");
            break;
        case XML_RELAXNG_PARENTREF:
            fprintf(output, "<parentRef");
            if (define->name != NULL)
                fprintf(output, " name=\"%s\"", define->name);
            fprintf(output, ">\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</parentRef>\n");
            break;
        case XML_RELAXNG_EXTERNALREF:
            fprintf(output, "<externalRef>");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</externalRef>\n");
            break;
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_VALUE:
            /* TODO */
            break;
        case XML_RELAXNG_START:
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_PARAM:
            /* TODO */
            break;
        case XML_RELAXNG_NOOP:
            xmlRelaxNGDumpDefines(output, define->content);
            break;
    }
}